

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::edit_distance::anon_unknown_1::Hunk::FlushEdits(Hunk *this)

{
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *this_00;
  int in_ECX;
  uint unaff_EBX;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_00000008;
  
  this_00 = &this->hunk_;
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::splice(this_00,(int)this_00,(__off64_t *)&this->hunk_removes_,in_ECX,in_R8,in_R9,unaff_EBX);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::splice(this_00,(int)this_00,(__off64_t *)&this->hunk_adds_,in_ECX,in_R8,in_R9,in_stack_00000008)
  ;
  return;
}

Assistant:

void FlushEdits() {
    hunk_.splice(hunk_.end(), hunk_removes_);
    hunk_.splice(hunk_.end(), hunk_adds_);
  }